

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table;
  char *pcVar1;
  int iVar2;
  ImGuiTableColumn *pIVar3;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    return (char *)0x0;
  }
  if (column_n < 0) {
    pcVar1 = TableGetColumnName(table,table->CurrentColumn);
    return pcVar1;
  }
  pIVar3 = (table->Columns).Data + column_n;
  if ((table->Columns).DataEnd <= pIVar3) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                ,0x1fb,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
  }
  iVar2 = (int)pIVar3->NameOffset;
  if (iVar2 == -1) {
    pcVar1 = (char *)0x0;
  }
  else {
    if ((table->ColumnsNames).Buf.Size <= iVar2) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x605,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    pcVar1 = (table->ColumnsNames).Buf.Data + iVar2;
  }
  return pcVar1;
}

Assistant:

const char*   ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}